

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void fmt::v5::internal::
     handle_char_specs<char,fmt::v5::internal::arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::char_spec_handler>
               (basic_format_specs<char> *specs,char_spec_handler *handler)

{
  if ((specs->type_ != '\0') && (specs->type_ != 'c')) {
    arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::
    char_spec_handler::on_int(handler);
    return;
  }
  if (((specs->super_align_spec).align_ == ALIGN_NUMERIC) || (specs->flags_ != 0)) {
    error_handler::on_error((error_handler *)handler,"invalid format specifier for char");
  }
  arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::
  char_spec_handler::on_char(handler);
  return;
}

Assistant:

FMT_CONSTEXPR void handle_char_specs(
    const basic_format_specs<Char> &specs, Handler &&handler) {
  if (specs.type() && specs.type() != 'c') {
    handler.on_int();
    return;
  }
  if (specs.align() == ALIGN_NUMERIC || specs.flag(~0u) != 0)
    handler.on_error("invalid format specifier for char");
  handler.on_char();
}